

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O1

void __thiscall
glslang::HlslParseContext::clearUniform(HlslParseContext *this,TQualifier *qualifier)

{
  qualifier->field_0xf = qualifier->field_0xf & 0x1f;
  qualifier->field_0x10 = qualifier->field_0x10 & 0xf0;
  qualifier->layoutOffset = -1;
  qualifier->layoutAlign = -1;
  *(ulong *)&qualifier->field_0x1c =
       *(ulong *)&qualifier->field_0x1c & 0xffff0000ffc07fff | 0xffff001f8000;
  qualifier->field_0x28 = 0xff;
  qualifier->layoutPushConstant = false;
  return;
}

Assistant:

void clearUniformLayout() // only uniform specific
    {
        layoutMatrix = ElmNone;
        layoutPacking = ElpNone;
        layoutOffset = layoutNotSet;
        layoutAlign = layoutNotSet;

        layoutSet = layoutSetEnd;
        layoutBinding = layoutBindingEnd;
        layoutAttachment = layoutAttachmentEnd;
    }